

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemMakeWriteable(Mem *pMem)

{
  int iVar1;
  int rc;
  Mem *pMem_local;
  
  if ((pMem->flags & 0x12) != 0) {
    if (((pMem->flags & 0x400) != 0) && (iVar1 = sqlite3VdbeMemExpandBlob(pMem), iVar1 != 0)) {
      return 7;
    }
    if (((pMem->szMalloc == 0) || (pMem->z != pMem->zMalloc)) &&
       (iVar1 = vdbeMemAddTerminator(pMem), iVar1 != 0)) {
      return iVar1;
    }
  }
  pMem->flags = pMem->flags & 0xbfff;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemMakeWriteable(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  if( (pMem->flags & (MEM_Str|MEM_Blob))!=0 ){
    if( ExpandBlob(pMem) ) return SQLITE_NOMEM;
    if( pMem->szMalloc==0 || pMem->z!=pMem->zMalloc ){
      int rc = vdbeMemAddTerminator(pMem);
      if( rc ) return rc;
    }
  }
  pMem->flags &= ~MEM_Ephem;
#ifdef SQLITE_DEBUG
  pMem->pScopyFrom = 0;
#endif

  return SQLITE_OK;
}